

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.t.cpp
# Opt level: O1

double * __thiscall dynamicgraph::SignalPtr<double,_int>::accessCopy(SignalPtr<double,_int> *this)

{
  int iVar1;
  double *pdVar2;
  Signal<double,_int> *pSVar3;
  undefined4 extraout_var;
  
  if (((this->modeNoThrow == true) &&
      (iVar1 = (*this->_vptr_SignalPtr[4])(this), (char)iVar1 == '\0')) &&
     ((&this->field_0x50)[(long)this->_vptr_SignalPtr[-3]] == '\x01')) {
    return *(double **)(&this->field_0x48 + (long)this->_vptr_SignalPtr[-3]);
  }
  pSVar3 = (Signal<double,_int> *)((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3]);
  if (this->signalPtr == pSVar3) {
    pdVar2 = pSVar3->Tcopy;
  }
  else {
    if (this->transmitAbstract != true) {
      pSVar3 = getPtr(this);
      iVar1 = (*(pSVar3->super_SignalBase<int>)._vptr_SignalBase[0x1d])(pSVar3);
      return (double *)CONCAT44(extraout_var,iVar1);
    }
    pdVar2 = this->transmitAbstractData;
  }
  return pdVar2;
}

Assistant:

const T &SignalPtr<T, Time>::accessCopy() const {
  if (modeNoThrow && (!isPlugged()) && Signal<T, Time>::copyInit)
    return Signal<T, Time>::accessCopy();
  else if (autoref())
    return Signal<T, Time>::accessCopy();
  else if (transmitAbstract)
    return *transmitAbstractData;
  else
    return getPtr()->accessCopy();
}